

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_can.c
# Opt level: O2

int csp_can1_tx(csp_iface_t *iface,uint16_t via,csp_packet_t *packet,int from_me)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint *puVar4;
  code *pcVar5;
  int iVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong __n;
  uint8_t frame_buf [8];
  
  uVar1 = (packet->id).dst;
  if (uVar1 == iface->addr) {
    iVar6 = 0;
    csp_qfifo_write(packet,iface,(void *)0x0);
  }
  else {
    uVar11 = (uint)via;
    puVar4 = (uint *)iface->interface_data;
    uVar10 = *puVar4;
    *puVar4 = uVar10 + 1;
    if (via == 0xffff) {
      uVar11 = (uint)uVar1;
    }
    uVar1 = (packet->id).src;
    uVar11 = (uVar11 & 0x1f) << 0x13;
    uVar10 = uVar10 & 0x3ff;
    uVar2 = packet->length;
    csp_id_prepend(packet);
    frame_buf._0_4_ = *(undefined4 *)packet->frame_begin;
    uVar3 = packet->length;
    frame_buf._4_2_ = uVar3 << 8 | uVar3 >> 8;
    bVar8 = 2;
    if (uVar3 < 3) {
      bVar8 = (byte)uVar3;
    }
    __n = (ulong)bVar8;
    memcpy(frame_buf + 6,&packet->field_12,__n);
    pcVar5 = *(code **)(puVar4 + 2);
    iVar6 = (*pcVar5)(iface->driver_data,
                      (uint)uVar2 * 0x80 + 0x280 & 0x3fc00 | (uVar1 & 0x1f) << 0x18 | uVar11 |
                      uVar10,frame_buf,bVar8 + 6);
    if (iVar6 == 0) {
      do {
        uVar12 = (uint)__n & 0xffff;
        uVar7 = (uint)packet->length;
        uVar9 = uVar7 - uVar12;
        if (uVar7 < uVar12 || uVar9 == 0) {
          csp_buffer_free(packet);
          return 0;
        }
        if (7 < (int)uVar9) {
          uVar9 = 8;
        }
        uVar12 = uVar12 + (uVar9 & 0xff);
        __n = (ulong)uVar12;
        iVar6 = (*pcVar5)(iface->driver_data,
                          ((packet->id).src & 0x1f) << 0x18 |
                          ((int)((uVar7 - uVar12) + 7) / 8 & 0xffU) << 10 | uVar11 | uVar10 |
                          0x40000,(long)&packet->field_12 + ((__n & 0xffff) - (ulong)(uVar9 & 0xff))
                         );
      } while (iVar6 == 0);
    }
    iface->tx_error = iface->tx_error + 1;
    iVar6 = -0xb;
  }
  return iVar6;
}

Assistant:

int csp_can1_tx(csp_iface_t * iface, uint16_t via, csp_packet_t * packet, int from_me) {

	/* Loopback */
	if (packet->id.dst == iface->addr) {
		csp_qfifo_write(packet, iface, NULL);
		return CSP_ERR_NONE;
	}

	csp_can_interface_data_t * ifdata = iface->interface_data;

	/* Get an unique CFP id - this should be locked to prevent access from multiple tasks */
	const uint32_t ident = ifdata->cfp_packet_counter++;

	/* Figure out destination node based on routing entry */
	const uint8_t dest = (via != CSP_NO_VIA_ADDRESS) ? via : packet->id.dst;

	uint32_t can_id = 0;
	uint8_t data_bytes = 0;
	uint8_t frame_buf[CAN_FRAME_SIZE];

	/**
	 * CSP 1.x Frame Header:
	 * Data offset is always 6.
	 */
	can_id = (CFP_MAKE_SRC(packet->id.src) |
			  CFP_MAKE_DST(dest) |
			  CFP_MAKE_ID(ident) |
			  CFP_MAKE_TYPE(CFP_BEGIN) |
			  CFP_MAKE_REMAIN((packet->length + CFP1_DATA_OFFSET - 1) / CAN_FRAME_SIZE));

	/**
	 * CSP 1.x Data field
	 *
	 * 4 byte CSP 1.0 header
	 * 2 byte length field
	 * 2 byte data (optional)
	 */

	/* Copy CSP 1.x headers and data: Always 4 bytes */
	csp_id_prepend(packet);
	memcpy(frame_buf + CFP1_CSP_HEADER_OFFSET, packet->frame_begin, CFP1_CSP_HEADER_SIZE);

	/* Copy length field, always 2 bytes */
	uint16_t csp_length_be = htobe16(packet->length);
	memcpy(frame_buf + CFP1_DATA_LEN_OFFSET, &csp_length_be, CFP1_DATA_LEN_SIZE);

	/* Calculate number of data bytes. Max 2 bytes possible */
	data_bytes = (packet->length <= CFP1_DATA_SIZE_BEGIN) ? packet->length : CFP1_DATA_SIZE_BEGIN;
	memcpy(frame_buf + CFP1_DATA_OFFSET, packet->data, data_bytes);

	/* Increment tx counter */
	uint16_t tx_count = data_bytes;

	const csp_can_driver_tx_t tx_func = ifdata->tx_func;

	/* Send first frame */
	if ((tx_func)(iface->driver_data, can_id, frame_buf, CFP1_DATA_OFFSET + data_bytes) != CSP_ERR_NONE) {
		iface->tx_error++;
		/* Does not free on return */
		return CSP_ERR_DRIVER;
	}

	/* Send next frames if not complete */
	while (tx_count < packet->length) {

		/**
		 * CSP 1.x Frame Header:
		 * Data offset is always 6.
		 */

		/* Calculate frame data bytes */
		data_bytes = (packet->length - tx_count >= CAN_FRAME_SIZE) ? CAN_FRAME_SIZE : packet->length - tx_count;

		/* Prepare identifier */
		can_id = (CFP_MAKE_SRC(packet->id.src) |
				  CFP_MAKE_DST(dest) |
				  CFP_MAKE_ID(ident) |
				  CFP_MAKE_TYPE(CFP_MORE) |
				  CFP_MAKE_REMAIN((packet->length - tx_count - data_bytes + CAN_FRAME_SIZE - 1) / CAN_FRAME_SIZE));

		/* Increment tx counter */
		tx_count += data_bytes;

		/* Send frame */
		if ((tx_func)(iface->driver_data, can_id, packet->data + tx_count - data_bytes, data_bytes) != CSP_ERR_NONE) {
			iface->tx_error++;
			/* Does not free on return */
			return CSP_ERR_DRIVER;
		}
	}

	csp_buffer_free(packet);

	return CSP_ERR_NONE;
}